

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

int countint(TValue *key,int *nums)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  
  if (key->tt == 3) {
    dVar1 = (key->value).n;
    if (((dVar1 == (double)(int)dVar1) && (!NAN(dVar1) && !NAN((double)(int)dVar1))) &&
       (uVar4 = (int)dVar1 - 1, uVar4 < 0x40000000)) {
      iVar3 = -1;
      uVar5 = uVar4;
      if (0xff < uVar4) {
        do {
          iVar3 = iVar3 + 8;
          uVar5 = uVar4 >> 8;
          bVar2 = 0xffff < uVar4;
          uVar4 = uVar5;
        } while (bVar2);
      }
      nums[(long)iVar3 + (ulong)(byte)luaO_log2_log_2[uVar5] + 1] =
           nums[(long)iVar3 + (ulong)(byte)luaO_log2_log_2[uVar5] + 1] + 1;
      return 1;
    }
  }
  return 0;
}

Assistant:

static int countint(const TValue*key,int*nums){
int k=arrayindex(key);
if(0<k&&k<=(1<<(32-2))){
nums[ceillog2(k)]++;
return 1;
}
else
return 0;
}